

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseTools.h
# Opt level: O2

unique_ptr<asio::io_context::strand,_std::default_delete<asio::io_context::strand>_> __thiscall
tonk::MakeUniqueNoThrow<asio::io_context::strand,asio::io_context&>(tonk *this,io_context *args)

{
  strand *this_00;
  
  this_00 = (strand *)operator_new(0x10,(nothrow_t *)&std::nothrow);
  if (this_00 != (strand *)0x0) {
    asio::io_context::strand::strand(this_00,args);
  }
  *(strand **)this = this_00;
  return (__uniq_ptr_data<asio::io_context::strand,_std::default_delete<asio::io_context::strand>,_true,_true>
          )(__uniq_ptr_data<asio::io_context::strand,_std::default_delete<asio::io_context::strand>,_true,_true>
            )this;
}

Assistant:

inline std::unique_ptr<T> MakeUniqueNoThrow(Args&&... args) {
    return std::unique_ptr<T>(new(std::nothrow) T(std::forward<Args>(args)...));
}